

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  int iVar1;
  int *piVar2;
  int *tmp;
  int val_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->spaceMax <= ctxt->spaceNr) {
    ctxt->spaceMax = ctxt->spaceMax << 1;
    piVar2 = (int *)(*xmlRealloc)(ctxt->spaceTab,(long)ctxt->spaceMax << 2);
    if (piVar2 == (int *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt->spaceMax = ctxt->spaceMax / 2;
      return -1;
    }
    ctxt->spaceTab = piVar2;
  }
  ctxt->spaceTab[ctxt->spaceNr] = val;
  ctxt->space = ctxt->spaceTab + ctxt->spaceNr;
  iVar1 = ctxt->spaceNr;
  ctxt->spaceNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;

	ctxt->spaceMax *= 2;
        tmp = (int *) xmlRealloc(ctxt->spaceTab,
	                         ctxt->spaceMax * sizeof(ctxt->spaceTab[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    ctxt->spaceMax /=2;
	    return(-1);
	}
	ctxt->spaceTab = tmp;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}